

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

void __thiscall MetricsDiscovery::MDHelper::PrintMetricNames(MDHelper *this,ostream *os)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  
  if ((((this->m_Initialized == true) && (this->m_ConcurrentGroup != (IConcurrentGroupLatest *)0x0))
      && (this->m_MetricSet != (IMetricSetLatest *)0x0)) &&
     (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"kernel,",7);
    lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
    iVar3 = (int)os;
    if (*(int *)(lVar4 + 0x20) != 0) {
      uVar7 = 0;
      do {
        plVar5 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x18))(this->m_MetricSet,uVar7);
        lVar4 = (**(code **)(*plVar5 + 0x10))(plVar5);
        pcVar2 = *(char **)(lVar4 + 8);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        if (this->m_IncludeMaxValues == true) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"max_",4);
          plVar5 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x18))(this->m_MetricSet,uVar7)
          ;
          lVar4 = (**(code **)(*plVar5 + 0x10))(plVar5);
          pcVar2 = *(char **)(lVar4 + 8);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        }
        uVar7 = uVar7 + 1;
        lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      } while (uVar7 < *(uint *)(lVar4 + 0x20));
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
    lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
    if (*(int *)(lVar4 + 0x24) != 0) {
      uVar7 = 0;
      do {
        plVar5 = (long *)(**(code **)(*(long *)this->m_MetricSet + 0x20))(this->m_MetricSet,uVar7);
        lVar4 = (**(code **)(*plVar5 + 0x10))(plVar5);
        pcVar2 = *(char **)(lVar4 + 8);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        uVar7 = uVar7 + 1;
        lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      } while (uVar7 < *(uint *)(lVar4 + 0x24));
    }
    if ((this->m_APIMask & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      lVar4 = (**(code **)(*(long *)this->m_ConcurrentGroup + 0x10))();
      iVar1 = *(int *)(lVar4 + 0x18);
      if (iVar1 != 0) {
        iVar8 = 0;
        do {
          plVar5 = (long *)(**(code **)(*(long *)this->m_ConcurrentGroup + 0x40))
                                     (this->m_ConcurrentGroup,iVar8);
          lVar4 = (**(code **)(*plVar5 + 0x10))(plVar5);
          pcVar2 = *(char **)(lVar4 + 8);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
          iVar8 = iVar8 + 1;
        } while (iVar1 != iVar8);
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void MDHelper::PrintMetricNames( std::ostream& os )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet || !os.good() )
    {
        DebugPrint("Can't PrintMetricNames!\n");
        return;
    }

    os << "kernel,";

    for( uint32_t i = 0; i < m_MetricSet->GetParams()->MetricsCount; i++ )
    {
        os << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        if( m_IncludeMaxValues )
        {
            os << "max_" << m_MetricSet->GetMetric( i )->GetParams()->SymbolName << ",";
        }
    }

    os << ",";

    for(uint32_t i = 0; i < m_MetricSet->GetParams()->InformationCount; i++)
    {
        os << m_MetricSet->GetInformation( i )->GetParams()->SymbolName << ",";
    }

    if( m_APIMask & API_TYPE_IOSTREAM )
    {
        os << ",";

        const uint32_t ioInfoCount =
            m_ConcurrentGroup->GetParams()->IoMeasurementInformationCount;
        for( uint32_t i = 0; i < ioInfoCount; i++ )
        {
            os << m_ConcurrentGroup->GetIoMeasurementInformation( i )->GetParams()->SymbolName << ",";
        }
    }

    os << std::endl;
}